

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::piece_picker::mark_as_downloading
          (piece_picker *this,piece_block block,torrent_peer *peer,picker_options_t options)

{
  download_queue_t dVar1;
  ushort uVar2;
  int iVar3;
  iterator iVar4;
  block_info *pbVar5;
  ushort uVar6;
  uint uVar7;
  piece_index_t index;
  long lVar8;
  piece_pos *this_00;
  span<libtorrent::aux::piece_picker::block_info> sVar9;
  
  index = block.piece_index.m_val;
  this_00 = (this->m_piece_map).
            super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
            .
            super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
            ._M_impl.super__Vector_impl_data._M_start + index.m_val;
  dVar1 = piece_pos::download_queue(this_00);
  lVar8 = (long)block >> 0x20;
  if (dVar1.m_val == '\x04') {
    iVar3 = piece_pos::priority(this_00,this);
    uVar7 = 0x14000000;
    if ((options.m_val & 2) == 0) {
      uVar7 = options.m_val & 2;
    }
    *(uint *)this_00 = *(uint *)this_00 & 0xe3ffffff | uVar7;
    if ((-1 < iVar3) && (this->m_dirty == false)) {
      update(this,iVar3,(prio_index_t)(this_00->index).m_val);
    }
    if ((char)options.m_val < '\0') {
      record_downloading_piece(this,index);
    }
    iVar4 = add_download_piece(this,index);
    sVar9 = mutable_blocks_for_piece(this,iVar4._M_current);
    if (*(ushort *)&sVar9.m_ptr[lVar8].field_0x8 < 0xc000) {
      pbVar5 = sVar9.m_ptr + lVar8;
      pbVar5->peer = peer;
      *(undefined2 *)&pbVar5->field_0x8 = 0x4001;
      *(ushort *)&(iVar4._M_current)->field_0xa =
           *(ushort *)&(iVar4._M_current)->field_0xa & 0x8000 |
           *(ushort *)&(iVar4._M_current)->field_0xa + 1 & 0x7fff;
      update_piece_state(this,iVar4);
      return true;
    }
  }
  else {
    dVar1 = piece_pos::download_queue(this_00);
    iVar4 = find_dl_piece(this,dVar1,index);
    sVar9 = mutable_blocks_for_piece(this,iVar4._M_current);
    if (-1 < *(short *)&sVar9.m_ptr[lVar8].field_0x8) {
      pbVar5 = sVar9.m_ptr + lVar8;
      if ((((options.m_val & 2) != 0) &&
          (1 < (byte)(((byte)((uint)*(undefined4 *)this_00 >> 0x1a) & 7) - 5))) &&
         ((*(ushort *)&(iVar4._M_current)->field_0xa & 0x7fff) == 0)) {
        iVar3 = piece_pos::priority(this_00,this);
        piece_pos::make_reverse(this_00);
        if ((-1 < iVar3) && (this->m_dirty == false)) {
          update(this,iVar3,(prio_index_t)(this_00->index).m_val);
        }
      }
      pbVar5->peer = peer;
      uVar2 = *(ushort *)&pbVar5->field_0x8;
      uVar6 = 0x4000;
      if ((uVar2 & 0xc000) != 0x4000) {
        *(ushort *)&pbVar5->field_0x8 = uVar2 & 0x3fff | 0x4000;
        *(ushort *)&(iVar4._M_current)->field_0xa =
             *(ushort *)&(iVar4._M_current)->field_0xa & 0x8000 |
             *(ushort *)&(iVar4._M_current)->field_0xa + 1 & 0x7fff;
        update_piece_state(this,iVar4);
        uVar2 = *(ushort *)&pbVar5->field_0x8;
        uVar6 = uVar2 & 0xc000;
      }
      *(ushort *)&pbVar5->field_0x8 = uVar6 | uVar2 + 1 & 0x3fff;
      if ((options.m_val & 2) != 0) {
        return true;
      }
      if (1 < (byte)(((byte)((uint)*(undefined4 *)this_00 >> 0x1a) & 7) - 5)) {
        return true;
      }
      iVar3 = piece_pos::priority(this_00,this);
      piece_pos::unreverse(this_00);
      if (iVar3 < 0) {
        return true;
      }
      if (this->m_dirty != false) {
        return true;
      }
      update(this,iVar3,(prio_index_t)(this_00->index).m_val);
      return true;
    }
  }
  return false;
}

Assistant:

bool piece_picker::mark_as_downloading(piece_block const block
		, aux::torrent_peer* peer, picker_options_t const options)
	{
#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "mark_as_downloading( {"
			<< block.piece_index << ", " << block.block_index << "} )" << std::endl;
#endif

		TORRENT_ASSERT(peer == nullptr || peer->in_use);
		TORRENT_ASSERT(block.block_index != piece_block::invalid.block_index);
		TORRENT_ASSERT(block.piece_index != piece_block::invalid.piece_index);
		TORRENT_ASSERT(block.piece_index < m_piece_map.end_index());
		TORRENT_ASSERT(block.block_index < blocks_in_piece(block.piece_index));
		TORRENT_ASSERT(!m_piece_map[block.piece_index].have());

		piece_pos& p = m_piece_map[block.piece_index];
		if (p.download_queue() == piece_pos::piece_open)
		{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
			INVARIANT_CHECK;
#endif
			int const prio = p.priority(this);
			TORRENT_ASSERT(prio < int(m_priority_boundaries.size())
				|| m_dirty);

			p.state((options & reverse)
				? piece_pos::piece_downloading_reverse
				: piece_pos::piece_downloading);

			if (prio >= 0 && !m_dirty) update(prio, p.index);

			// if the piece extent affinity is enabled, (maybe) record downloading a
			// block from this piece to make other peers prefer adjacent pieces
			// if reverse is set, don't encourage other peers to pick nearby
			// pieces, as that's assumed to be low priority.
			// if time critical mode is enabled, we're likely to either download
			// adjacent pieces anyway, but more importantly, we don't want to
			// create artificially higher priority for adjacent pieces if they
			// aren't important or urgent
			if (options & piece_extent_affinity)
				record_downloading_piece(block.piece_index);

			auto const dp = add_download_piece(block.piece_index);
			auto const binfo = mutable_blocks_for_piece(*dp);
			block_info& info = binfo[block.block_index];
			TORRENT_ASSERT(info.piece_index == block.piece_index);
			if (info.state == block_info::state_finished)
				return false;

			info.state = block_info::state_requested;
			info.peer = peer;
			info.num_peers = 1;
#if TORRENT_USE_ASSERTS
			TORRENT_ASSERT(info.peers.count(peer) == 0);
			info.peers.insert(peer);
#endif
			++dp->requested;
			// update_full may move the downloading piece to
			// a different vector, so 'dp' may be invalid after
			// this call
			update_piece_state(dp);
		}
		else
		{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
			INVARIANT_CHECK;
#endif
			auto i = find_dl_piece(p.download_queue(), block.piece_index);
			TORRENT_ASSERT(i != m_downloads[p.download_queue()].end());
			auto const binfo = mutable_blocks_for_piece(*i);
			block_info& info = binfo[block.block_index];
			TORRENT_ASSERT(info.piece_index == block.piece_index);
			if (info.state == block_info::state_writing
				|| info.state == block_info::state_finished)
			{
				return false;
			}

			if ((options & reverse) && !p.reverse() && i->requested == 0)
			{
				// this piece isn't reverse, but there's no other peer
				// downloading from it and we just requested a block from a
				// reverse peer. Make it reverse
				int prio = p.priority(this);
				p.make_reverse();
				if (prio >= 0 && !m_dirty) update(prio, p.index);
			}

			TORRENT_ASSERT(info.state == block_info::state_none
				|| (info.state == block_info::state_requested
					&& (info.num_peers > 0)));
			info.peer = peer;
			if (info.state != block_info::state_requested)
			{
				info.state = block_info::state_requested;
				++i->requested;
				i = update_piece_state(i);
			}
			++info.num_peers;

			// if we make a non-reverse request from a reversed piece,
			// undo the reverse state
			if (!(options & reverse) && p.reverse())
			{
				int prio = p.priority(this);
				// make it non-reverse
				p.unreverse();
				if (prio >= 0 && !m_dirty) update(prio, p.index);
			}

#if TORRENT_USE_ASSERTS
			TORRENT_ASSERT(info.peers.count(peer) == 0);
			info.peers.insert(peer);
#endif
		}
		return true;
	}